

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

void __thiscall Gluco::Solver::toDimacs(Solver *this,FILE *f,vec<Gluco::Lit> *assumps)

{
  uint uVar1;
  bool bVar2;
  Var VVar3;
  ulong uVar4;
  Clause *pCVar5;
  uint *puVar6;
  char *pcVar7;
  long lVar8;
  int j;
  int iVar9;
  long lVar10;
  lbool local_59;
  Var max;
  uint local_54;
  RegionAllocator<unsigned_int> *local_50;
  vec<int> map;
  
  if (this->ok == false) {
    fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
    return;
  }
  max = 0;
  map.data = (int *)0x0;
  map.sz = 0;
  map.cap = 0;
  local_50 = &(this->ca).super_RegionAllocator<unsigned_int>;
  lVar8 = 0;
  iVar9 = 0;
  while( true ) {
    uVar4 = (ulong)(this->clauses).sz;
    if ((long)uVar4 <= lVar8) break;
    pCVar5 = (Clause *)
             RegionAllocator<unsigned_int>::operator[](local_50,(this->clauses).data[lVar8]);
    bVar2 = satisfied(this,pCVar5);
    iVar9 = iVar9 + (uint)!bVar2;
    lVar8 = lVar8 + 1;
  }
  local_54 = iVar9;
  for (lVar8 = 0; lVar8 < (int)uVar4; lVar8 = lVar8 + 1) {
    pCVar5 = (Clause *)
             RegionAllocator<unsigned_int>::operator[](local_50,(this->clauses).data[lVar8]);
    bVar2 = satisfied(this,pCVar5);
    if (!bVar2) {
      puVar6 = RegionAllocator<unsigned_int>::operator[](local_50,(this->clauses).data[lVar8]);
      for (lVar10 = 0; lVar10 < (int)puVar6[1]; lVar10 = lVar10 + 1) {
        local_59.value =
             (byte)puVar6[lVar10 + 3] & 1 ^ (this->assigns).data[(int)puVar6[lVar10 + 3] >> 1].value
        ;
        bVar2 = lbool::operator!=(&local_59,(lbool)0x1);
        if (bVar2) {
          mapVar((int)puVar6[lVar10 + 3] >> 1,&map,&max);
        }
      }
    }
    uVar4 = (ulong)(uint)(this->clauses).sz;
  }
  local_54 = local_54 + (this->assumptions).sz;
  fprintf((FILE *)f,"p cnf %d %d\n",(ulong)(uint)max);
  lVar8 = 0;
  while( true ) {
    if ((this->assumptions).sz <= lVar8) {
      for (lVar8 = 0; lVar8 < (this->clauses).sz; lVar8 = lVar8 + 1) {
        pCVar5 = (Clause *)
                 RegionAllocator<unsigned_int>::operator[](local_50,(this->clauses).data[lVar8]);
        toDimacs(this,f,pCVar5,&map,&max);
      }
      if (0 < this->verbosity) {
        printf("Wrote %d clauses with %d variables.\n",(ulong)local_54,(ulong)(uint)max);
      }
      vec<int>::~vec(&map);
      return;
    }
    iVar9 = (this->assumptions).data[lVar8].x;
    local_59.value = (byte)iVar9 & 1 ^ (this->assigns).data[iVar9 >> 1].value;
    bVar2 = lbool::operator!=(&local_59,(lbool)0x1);
    if (!bVar2) break;
    uVar1 = (this->assumptions).data[lVar8].x;
    VVar3 = mapVar((int)uVar1 >> 1,&map,&max);
    pcVar7 = "-";
    if ((uVar1 & 1) == 0) {
      pcVar7 = "";
    }
    fprintf((FILE *)f,"%s%d 0\n",pcVar7,(ulong)(VVar3 + 1));
    lVar8 = lVar8 + 1;
  }
  __assert_fail("value(assumptions[i]) != l_False",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Glucose.cpp"
                ,0x55b,"void Gluco::Solver::toDimacs(FILE *, const vec<Lit> &)");
}

Assistant:

void Solver::toDimacs(FILE* f, const vec<Lit>& assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok){
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return; }

    vec<Var> map; Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int i, cnt = 0;
    for (i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]]))
            cnt++;
        
    for (i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])){
            Clause& c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumptions.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (i = 0; i < assumptions.size(); i++){
        assert(value(assumptions[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumptions[i]) ? "-" : "", mapVar(var(assumptions[i]), map, max)+1);
    }

    for (i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0)
        printf("Wrote %d clauses with %d variables.\n", cnt, max);
}